

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testRandom.cpp
# Opt level: O0

void anon_unknown.dwarf_85aa3::testSolidSphere<Imath_2_5::Rand32>(void)

{
  int iVar1;
  float fVar2;
  int i_2;
  float l;
  V3f p;
  int i_1;
  Rand32 rand;
  int i;
  int v [11];
  int M;
  int N;
  unsigned_long in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  Vec3<float> *in_stack_ffffffffffffffa8;
  int local_4c;
  Rand32 *in_stack_ffffffffffffffb8;
  int local_3c;
  int aiStack_38 [12];
  undefined4 local_8;
  undefined4 local_4;
  
  local_4 = 10;
  local_8 = 10000;
  for (local_3c = 0; local_3c < 0xb; local_3c = local_3c + 1) {
    aiStack_38[local_3c] = 0;
  }
  Imath_2_5::Rand32::Rand32
            ((Rand32 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff98);
  local_4c = 0;
  while( true ) {
    if (99999 < local_4c) {
      iVar1 = 0;
      while( true ) {
        if (9 < iVar1) {
          return;
        }
        if (aiStack_38[iVar1] < 1) break;
        iVar1 = iVar1 + 1;
      }
      __assert_fail("v[i] > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                    ,0xd5,"void (anonymous namespace)::testSolidSphere() [Rand = Imath_2_5::Rand32]"
                   );
    }
    Imath_2_5::solidSphereRand<Imath_2_5::Vec3<float>,Imath_2_5::Rand32>(in_stack_ffffffffffffffb8);
    fVar2 = Imath_2_5::Vec3<float>::length(in_stack_ffffffffffffffa8);
    iVar1 = Imath_2_5::floor<float>(fVar2 * 10.0);
    aiStack_38[iVar1] = aiStack_38[iVar1] + 1;
    if (1.00001 <= fVar2) break;
    local_4c = local_4c + 1;
  }
  __assert_fail("l < 1.00001",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testRandom.cpp"
                ,0xd1,"void (anonymous namespace)::testSolidSphere() [Rand = Imath_2_5::Rand32]");
}

Assistant:

void
testSolidSphere ()
{
    const int N = 10;
    const int M = 10000;
    int v[N + 1];

    for (int i = 0; i <= N; ++i)
	v[i] = 0;

    Rand rand (0);

    for (int i = 0; i < M * N; ++i)
    {
	IMATH_INTERNAL_NAMESPACE::V3f p = IMATH_INTERNAL_NAMESPACE::solidSphereRand<IMATH_INTERNAL_NAMESPACE::V3f> (rand);
	float l = p.length();
	v[IMATH_INTERNAL_NAMESPACE::floor (l * N)] += 1;

	assert (l < 1.00001);
    }

    for (int i = 0; i < N; ++i)
	assert (v[i] > 0);
}